

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::GenLoadShader<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<float,_4> *expected_value)

{
  ostream *poVar1;
  undefined4 in_register_0000000c;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLenum e_05;
  uint uVar2;
  char *pcVar3;
  ostringstream os;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::operator<<(&local_1a0,"#version 420 core");
  uVar2 = (uint)this;
  if (uVar2 == 4) {
    std::operator<<(&local_1a0,"\n#extension GL_ARB_compute_shader : require");
  }
  poVar1 = std::operator<<(&local_1a0,"\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_3a0,(void *)(ulong)(uint)stage,e);
  poVar1 = std::operator<<(poVar1,(string *)&local_3a0);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_1c0,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1e0,(void *)(ulong)(uint)stage,e_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_200,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_220,(void *)(ulong)(uint)stage,e_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_240,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"image2DRect g_image_2drect;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_260,(void *)(ulong)(uint)stage,e_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_280,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a0,(void *)(ulong)(uint)stage,e_03);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_2c0,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
  poVar1 = std::operator<<(poVar1,"image1DArray g_image_1darray;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2e0,(void *)(ulong)(uint)stage,e_04);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_300,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_300);
  poVar1 = std::operator<<(poVar1,"image2DArray g_image_2darray;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_320,(void *)(ulong)(uint)stage,e_05);
  poVar1 = std::operator<<(poVar1,(string *)&local_320);
  pcVar3 = ") readonly uniform ";
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_340,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_340);
  pcVar3 = 
  "imageCubeArray g_image_cube_array;\nlayout(rgba32f) writeonly uniform image2D g_image_result;\nuniform "
  ;
  poVar1 = std::operator<<(poVar1,
                           "imageCubeArray g_image_cube_array;\nlayout(rgba32f) writeonly uniform image2D g_image_result;\nuniform "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_360,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_360);
  pcVar3 = "vec4 g_value = ";
  poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_380,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_380);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)CONCAT44(in_register_0000000c,internalformat))
  ;
  std::operator<<(poVar1,";\nuniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);");
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  if (uVar2 < 4) {
    pcVar3 = (&PTR_anon_var_dwarf_30cb52_01dcc7e0)[(ulong)this & 0xffffffff];
  }
  else {
    if (uVar2 != 4) goto LAB_00a4f009;
    pcVar3 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);"
    ;
  }
  std::operator<<(&local_1a0,pcVar3);
LAB_00a4f009:
  pcVar3 = "\n  vec4 r = vec4(0, 1, 0, 1);\n  ";
  poVar1 = std::operator<<(&local_1a0,"\n  vec4 r = vec4(0, 1, 0, 1);\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_3a0,pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_3a0);
  std::operator<<(poVar1,
                  "vec4 v;\n  v = imageLoad(g_image_2d, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_1darray, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_cube_array, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  imageStore(g_image_result, coord, r);\n}"
                 );
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenLoadShader(int stage, GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << "#version 420 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>() << "image3D g_image_3d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>() << "image2DRect g_image_2drect;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>() << "image2DArray g_image_2darray;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCubeArray g_image_cube_array;" NL "layout(rgba32f) writeonly uniform image2D g_image_result;" NL
			  "uniform "
		   << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4" << expected_value
		   << ";" NL "uniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  vec4 r = vec4(0, 1, 0, 1);" NL "  " << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_2d, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  v = imageLoad(g_image_2drect, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  v = imageLoad(g_image_1darray, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_cube_array, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  imageStore(g_image_result, coord, r);" NL "}";
		return os.str();
	}